

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [12];
  int *piVar2;
  uint *puVar3;
  undefined4 uVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  uint uVar13;
  int iVar14;
  int iVar15;
  undefined4 extraout_EAX;
  parasail_result_t *ppVar16;
  __m128i *palVar17;
  __m128i *palVar18;
  __m128i *palVar19;
  __m128i *palVar20;
  __m128i *ptr;
  __m128i *ptr_00;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int32_t *ptr_01;
  __m128i *ptr_02;
  uint uVar21;
  uint uVar22;
  char *pcVar23;
  int32_t iVar24;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  __m128i *ptr_03;
  undefined8 uVar25;
  uint uVar26;
  __m128i *ptr_04;
  int iVar27;
  char *__format;
  int iVar28;
  __m128i *ptr_05;
  long lVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  int32_t t;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar45;
  int iVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar46;
  int iVar48;
  int iVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar44 [16];
  uint uVar50;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  undefined1 auVar51 [16];
  int iVar60;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i alVar55;
  undefined1 auVar56 [16];
  uint uVar61;
  uint uVar67;
  uint uVar68;
  undefined1 auVar62 [16];
  uint uVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lVar69;
  __m128i alVar66;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i alVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar90;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  __m128i vH_06;
  int32_t in_stack_fffffffffffffd08;
  int local_2f0;
  __m128i *local_2e0;
  __m128i *local_2d0;
  __m128i *local_2c8;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 local_228 [16];
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  int local_128;
  int iStack_124;
  int iStack_120;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  __m128i_32_t e;
  __m128i_32_t h;
  size_t len;
  longlong extraout_RDX_00;
  ulong uVar71;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "profile";
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "profile->profile32.score";
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar23 = "profile->matrix";
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar23 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar23 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "open";
        }
        else {
          if (-1 < gap) {
            uVar26 = uVar5 - 1;
            uVar34 = (ulong)uVar5 + 3 >> 2;
            uVar71 = (ulong)uVar26 % uVar34;
            iVar30 = -open;
            iVar27 = ppVar7->min;
            uVar33 = 0x80000000 - iVar27;
            if (iVar27 != iVar30 && SBORROW4(iVar27,iVar30) == iVar27 + open < 0) {
              uVar33 = open | 0x80000000;
            }
            pvVar8 = (profile->profile32).matches;
            uVar13 = 0x7ffffffe - ppVar7->max;
            pvVar9 = (profile->profile32).similar;
            ppVar16 = parasail_result_new_table3((uint)((ulong)uVar5 + 3) & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4430802;
              local_2e0 = parasail_memalign___m128i(0x10,uVar34);
              palVar17 = parasail_memalign___m128i(0x10,uVar34);
              local_2c8 = parasail_memalign___m128i(0x10,uVar34);
              palVar18 = parasail_memalign___m128i(0x10,uVar34);
              local_2d0 = parasail_memalign___m128i(0x10,uVar34);
              palVar19 = parasail_memalign___m128i(0x10,uVar34);
              palVar20 = parasail_memalign___m128i(0x10,uVar34);
              ptr = parasail_memalign___m128i(0x10,uVar34);
              ptr_00 = parasail_memalign___m128i(0x10,uVar34);
              b = parasail_memalign___m128i(0x10,uVar34);
              b_00 = parasail_memalign___m128i(0x10,uVar34);
              b_01 = parasail_memalign___m128i(0x10,uVar34);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = b_00 == (__m128i *)0x0;
              auVar38._0_8_ = -(ulong)(local_2e0 == (__m128i *)0x0);
              auVar38._8_8_ = -(ulong)(palVar17 == (__m128i *)0x0);
              auVar62._0_8_ = -(ulong)(local_2c8 == (__m128i *)0x0);
              auVar62._8_8_ = -(ulong)(palVar18 == (__m128i *)0x0);
              auVar38 = packssdw(auVar38,auVar62);
              auVar65._0_8_ = -(ulong)(local_2d0 == (__m128i *)0x0);
              auVar65._8_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
              auVar96._0_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
              auVar96._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar62 = packssdw(auVar65,auVar96);
              auVar38 = packssdw(auVar38,auVar62);
              uVar35 = 0;
              if (((((b != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) && b_00 != (__m128i *)0x0) &&
                   b_01 != (__m128i *)0x0) && ptr_01 != (int32_t *)0x0) &&
                  ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar38 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar38 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar38 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar38 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar38 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar38 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar38 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar38 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar38 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar38 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar38[0xf])) {
                iVar14 = s2Len + -1;
                uVar21 = 3 - (int)(uVar26 / uVar34);
                len = (size_t)uVar21;
                iVar15 = uVar33 + 1;
                c[0] = uVar34;
                parasail_memset___m128i(local_2c8,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar34;
                parasail_memset___m128i(local_2d0,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar34;
                parasail_memset___m128i(palVar20,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar34;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar34;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar34;
                parasail_memset___m128i(b_01,c_04,len);
                uVar33 = (uint)uVar34;
                iVar27 = iVar30;
                for (; uVar35 != uVar34; uVar35 = uVar35 + 1) {
                  iVar28 = iVar27;
                  for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                    iVar46 = 0;
                    if (s1_beg == 0) {
                      iVar46 = iVar28;
                    }
                    *(int *)((long)&h + lVar29 * 4) = iVar46;
                    lVar31 = (long)iVar46 - (ulong)(uint)open;
                    if (lVar31 < -0x7fffffff) {
                      lVar31 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar29 * 4) = (int)lVar31;
                    iVar28 = iVar28 - gap * uVar33;
                  }
                  local_2e0[uVar35][0] = h.m[0];
                  local_2e0[uVar35][1] = h.m[1];
                  ptr_00[uVar35][0] = e.m[0];
                  ptr_00[uVar35][1] = e.m[1];
                  iVar27 = iVar27 - gap;
                }
                *ptr_01 = 0;
                iVar27 = iVar30;
                for (uVar35 = 1; s2Len + 1 != uVar35; uVar35 = uVar35 + 1) {
                  iVar24 = 0;
                  if (s2_beg == 0) {
                    iVar24 = iVar27;
                  }
                  ptr_01[uVar35] = iVar24;
                  iVar27 = iVar27 - gap;
                }
                uVar22 = uVar33 - 1;
                uVar35 = 0;
                auVar74._4_4_ = iVar15;
                auVar74._0_4_ = iVar15;
                auVar74._8_4_ = iVar15;
                auVar74._12_4_ = iVar15;
                local_2f0 = iVar14;
                local_228 = auVar74;
                local_168 = auVar74;
                local_158 = auVar74;
                local_148 = auVar74;
                local_238 = uVar13;
                uStack_234 = uVar13;
                uStack_230 = uVar13;
                uStack_22c = uVar13;
                do {
                  ptr_05 = palVar18;
                  ptr_04 = palVar19;
                  ptr_03 = palVar20;
                  ptr_02 = palVar17;
                  if (uVar35 == (uint)s2Len) {
                    if (s2_end == 0) {
                      iVar27 = 0;
                      uVar34 = 0;
                      iVar30 = 0;
                      iVar28 = iVar15;
                    }
                    else {
                      iVar27 = 0;
                      while( true ) {
                        uVar34 = local_168._0_8_;
                        lVar29 = local_168._8_8_;
                        uVar35 = local_148._0_8_;
                        lVar31 = local_148._8_8_;
                        uVar32 = local_158._0_8_;
                        lVar69 = local_158._8_8_;
                        if ((int)uVar21 <= iVar27) break;
                        local_168._0_8_ = uVar34 << 0x20;
                        local_168._8_8_ = lVar29 << 0x20 | uVar34 >> 0x20;
                        local_148._0_8_ = uVar35 << 0x20;
                        local_148._8_8_ = lVar31 << 0x20 | uVar35 >> 0x20;
                        lVar29 = auVar74._8_8_;
                        uVar34 = auVar74._0_8_;
                        auVar74._0_8_ = uVar34 << 0x20;
                        auVar74._8_8_ = lVar29 << 0x20 | uVar34 >> 0x20;
                        local_158._0_8_ = uVar32 << 0x20;
                        local_158._8_8_ = lVar69 << 0x20 | uVar32 >> 0x20;
                        iVar27 = iVar27 + 1;
                      }
                      iVar27 = local_148._12_4_;
                      uVar34 = extractps(auVar74,3);
                      iVar30 = local_158._12_4_;
                      iVar28 = local_168._12_4_;
                    }
                    iVar46 = (int)uVar34;
                    uVar22 = uVar26;
                    if (s1_end != 0) {
                      uVar35 = 0;
                      while( true ) {
                        iVar46 = (int)uVar34;
                        if ((uVar33 & 0x1fffffff) << 2 == (uint)uVar35) break;
                        uVar50 = ((uint)uVar35 & 3) * uVar33 + ((uint)(uVar35 >> 2) & 0x3fffffff);
                        if ((int)uVar50 < (int)uVar5) {
                          iVar46 = *(int *)((long)*local_2e0 + uVar35 * 4);
                          if ((iVar28 < iVar46) ||
                             (((iVar46 == iVar28 && (local_2f0 == iVar14)) &&
                              (iVar46 = iVar28, (int)uVar50 < (int)uVar22)))) {
                            iVar28 = iVar46;
                            iVar27 = *(int *)((long)*local_2c8 + uVar35 * 4);
                            uVar34 = (ulong)*(uint *)((long)*local_2d0 + uVar35 * 4);
                            iVar30 = *(int *)((long)*ptr_03 + uVar35 * 4);
                            local_2f0 = iVar14;
                            uVar22 = uVar50;
                          }
                        }
                        uVar35 = uVar35 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar43 = local_2e0[uVar71];
                      alVar55 = local_2c8[uVar71];
                      alVar66 = local_2d0[uVar71];
                      alVar75 = ptr_03[uVar71];
                      iVar27 = 0;
                      while( true ) {
                        uVar71 = alVar43[0];
                        lVar29 = alVar43[1];
                        uVar34 = alVar55[0];
                        lVar31 = alVar55[1];
                        uVar35 = alVar66[0];
                        lVar69 = alVar66[1];
                        if ((int)uVar21 <= iVar27) break;
                        alVar43[0] = uVar71 << 0x20;
                        alVar43[1] = lVar29 << 0x20 | uVar71 >> 0x20;
                        alVar55[0] = uVar34 << 0x20;
                        alVar55[1] = lVar31 << 0x20 | uVar34 >> 0x20;
                        alVar66[0] = uVar35 << 0x20;
                        alVar66[1] = lVar69 << 0x20 | uVar35 >> 0x20;
                        lVar29 = alVar75[1];
                        uVar71 = alVar75[0];
                        alVar75[0] = uVar71 << 0x20;
                        alVar75[1] = lVar29 << 0x20 | uVar71 >> 0x20;
                        iVar27 = iVar27 + 1;
                      }
                      iVar28 = alVar43[1]._4_4_;
                      iVar27 = alVar55[1]._4_4_;
                      iVar46 = alVar66[1]._4_4_;
                      uVar25 = extractps((undefined1  [16])alVar75,3);
                      iVar30 = (int)uVar25;
                      uVar22 = uVar26;
                      local_2f0 = iVar14;
                    }
                    auVar44._0_4_ = -(uint)((int)local_238 < iVar15);
                    auVar44._4_4_ = -(uint)((int)uStack_234 < iVar15);
                    auVar44._8_4_ = -(uint)((int)uStack_230 < iVar15);
                    auVar44._12_4_ = -(uint)((int)uStack_22c < iVar15);
                    auVar56._0_4_ = -(uint)((int)uVar13 < (int)local_228._0_4_);
                    auVar56._4_4_ = -(uint)((int)uVar13 < (int)local_228._4_4_);
                    auVar56._8_4_ = -(uint)((int)uVar13 < (int)local_228._8_4_);
                    auVar56._12_4_ = -(uint)((int)uVar13 < (int)local_228._12_4_);
                    iVar14 = movmskps(s1_end,auVar56 | auVar44);
                    if (iVar14 != 0) {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      iVar28 = 0;
                      iVar27 = 0;
                      iVar46 = 0;
                      iVar30 = 0;
                      local_2f0 = 0;
                      uVar22 = 0;
                    }
                    ppVar16->score = iVar28;
                    ppVar16->end_query = uVar22;
                    ppVar16->end_ref = local_2f0;
                    ((ppVar16->field_4).stats)->matches = iVar27;
                    ((ppVar16->field_4).stats)->similar = iVar46;
                    ((ppVar16->field_4).stats)->length = iVar30;
                    parasail_free(ptr_01);
                    parasail_free(b_01);
                    parasail_free(b_00);
                    parasail_free(b);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_03);
                    parasail_free(ptr_04);
                    parasail_free(local_2d0);
                    parasail_free(ptr_05);
                    parasail_free(local_2c8);
                    parasail_free(ptr_02);
                    parasail_free(local_2e0);
                    return ppVar16;
                  }
                  palVar17 = local_2e0 + uVar22;
                  uVar32 = local_2c8[uVar22][0];
                  uVar36 = local_2d0[uVar22][0];
                  uVar10 = ptr_03[uVar22][0];
                  auVar80._0_8_ = uVar32 << 0x20;
                  auVar80._8_8_ = local_2c8[uVar22][1] << 0x20 | uVar32 >> 0x20;
                  auVar76._0_8_ = uVar36 << 0x20;
                  auVar76._8_8_ = local_2d0[uVar22][1] << 0x20 | uVar36 >> 0x20;
                  palVar20 = local_2e0 + uVar22;
                  iVar27 = (int)(*palVar20)[0];
                  iVar28 = *(int *)((long)*palVar20 + 4);
                  iVar46 = (int)(*palVar20)[1];
                  iVar24 = ptr_01[uVar35];
                  auVar72._0_8_ = uVar10 << 0x20;
                  auVar72._8_8_ = ptr_03[uVar22][1] << 0x20 | uVar10 >> 0x20;
                  lVar31 = (long)(int)(ppVar7->mapper[(byte)s2[uVar35]] * uVar33) * 0x10;
                  auVar85 = ZEXT816(0);
                  uVar36 = 0;
                  auVar97._4_4_ = iVar15;
                  auVar97._0_4_ = iVar15;
                  auVar97._8_4_ = iVar15;
                  auVar97._12_4_ = iVar15;
                  auVar86 = ZEXT816(0);
                  uVar32 = uVar35;
                  auVar88 = _DAT_008a1fe0;
                  for (lVar29 = 0; t = (int32_t)uVar35, uVar34 << 4 != lVar29;
                      lVar29 = lVar29 + 0x10) {
                    pauVar1 = (undefined1 (*) [12])((long)*ptr_00 + lVar29);
                    iVar37 = *(int *)*pauVar1;
                    iVar48 = *(int *)(*pauVar1 + 4);
                    iVar45 = *(int *)(*pauVar1 + 8);
                    auVar12 = *pauVar1;
                    iVar60 = *(int *)pauVar1[1];
                    auVar38 = *(undefined1 (*) [16])((long)*b + lVar29);
                    auVar62 = *(undefined1 (*) [16])((long)*b_00 + lVar29);
                    auVar65 = *(undefined1 (*) [16])((long)*b_01 + lVar29);
                    piVar2 = (int *)((long)pvVar6 + lVar29 + lVar31);
                    uVar50 = iVar24 + *piVar2;
                    uVar57 = iVar27 + piVar2[1];
                    uVar58 = iVar28 + piVar2[2];
                    uVar59 = iVar46 + piVar2[3];
                    uVar61 = (uint)((int)uVar50 < iVar37) * iVar37 |
                             ((int)uVar50 >= iVar37) * uVar50;
                    uVar67 = (uint)((int)uVar57 < iVar48) * iVar48 |
                             ((int)uVar57 >= iVar48) * uVar57;
                    uVar68 = (uint)((int)uVar58 < iVar45) * iVar45 |
                             ((int)uVar58 >= iVar45) * uVar58;
                    uVar70 = (uint)((int)uVar59 < iVar60) * iVar60 |
                             ((int)uVar59 >= iVar60) * uVar59;
                    iVar27 = auVar97._0_4_;
                    uVar81 = (uint)((int)uVar61 < iVar27) * iVar27 |
                             ((int)uVar61 >= iVar27) * uVar61;
                    iVar46 = auVar97._4_4_;
                    uVar82 = (uint)((int)uVar67 < iVar46) * iVar46 |
                             ((int)uVar67 >= iVar46) * uVar67;
                    iVar48 = auVar97._8_4_;
                    uVar83 = (uint)((int)uVar68 < iVar48) * iVar48 |
                             ((int)uVar68 >= iVar48) * uVar68;
                    iVar49 = auVar97._12_4_;
                    uVar84 = (uint)((int)uVar70 < iVar49) * iVar49 |
                             ((int)uVar70 >= iVar49) * uVar70;
                    puVar3 = (uint *)((long)*ptr_02 + lVar29);
                    *puVar3 = uVar81;
                    puVar3[1] = uVar82;
                    puVar3[2] = uVar83;
                    puVar3[3] = uVar84;
                    auVar63._0_4_ = -(uint)(iVar27 < (int)uVar61);
                    auVar63._4_4_ = -(uint)(iVar46 < (int)uVar67);
                    auVar63._8_4_ = -(uint)(iVar48 < (int)uVar68);
                    auVar63._12_4_ = -(uint)(iVar49 < (int)uVar70);
                    auVar96 = blendvps(auVar85,auVar38,auVar63);
                    piVar2 = (int *)((long)pvVar8 + lVar29 + lVar31);
                    auVar79._0_4_ = auVar80._0_4_ + *piVar2;
                    auVar79._4_4_ = auVar80._4_4_ + piVar2[1];
                    auVar79._8_4_ = auVar80._8_4_ + piVar2[2];
                    auVar79._12_4_ = auVar80._12_4_ + piVar2[3];
                    auVar51._0_4_ = -(uint)(uVar50 == uVar81);
                    auVar51._4_4_ = -(uint)(uVar57 == uVar82);
                    auVar51._8_4_ = -(uint)(uVar58 == uVar83);
                    auVar51._12_4_ = -(uint)(uVar59 == uVar84);
                    auVar97 = blendvps(auVar96,auVar79,auVar51);
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar29) = auVar97;
                    auVar96 = blendvps(auVar86,auVar62,auVar63);
                    piVar2 = (int *)((long)pvVar9 + lVar29 + lVar31);
                    auVar77._0_4_ = auVar76._0_4_ + *piVar2;
                    auVar77._4_4_ = auVar76._4_4_ + piVar2[1];
                    auVar77._8_4_ = auVar76._8_4_ + piVar2[2];
                    auVar77._12_4_ = auVar76._12_4_ + piVar2[3];
                    auVar80 = blendvps(auVar96,auVar77,auVar51);
                    auVar96 = blendvps(auVar88,auVar65,auVar63);
                    auVar73._0_4_ = auVar72._0_4_ + 1;
                    auVar73._4_4_ = auVar72._4_4_ + 1;
                    auVar73._8_4_ = auVar72._8_4_ + 1;
                    auVar73._12_4_ = auVar72._12_4_ + 1;
                    auVar96 = blendvps(auVar96,auVar73,auVar51);
                    uVar50 = ((int)local_228._0_4_ < (int)uVar81) * uVar81 |
                             (uint)((int)local_228._0_4_ >= (int)uVar81) * local_228._0_4_;
                    uVar57 = ((int)local_228._4_4_ < (int)uVar82) * uVar82 |
                             (uint)((int)local_228._4_4_ >= (int)uVar82) * local_228._4_4_;
                    uVar58 = ((int)local_228._8_4_ < (int)uVar83) * uVar83 |
                             (uint)((int)local_228._8_4_ >= (int)uVar83) * local_228._8_4_;
                    uVar59 = ((int)local_228._12_4_ < (int)uVar84) * uVar84 |
                             (uint)((int)local_228._12_4_ >= (int)uVar84) * local_228._12_4_;
                    iVar28 = auVar97._0_4_;
                    uVar61 = (uint)((int)uVar50 < iVar28) * iVar28 |
                             ((int)uVar50 >= iVar28) * uVar50;
                    iVar28 = auVar97._4_4_;
                    uVar67 = (uint)((int)uVar57 < iVar28) * iVar28 |
                             ((int)uVar57 >= iVar28) * uVar57;
                    iVar28 = auVar97._8_4_;
                    uVar68 = (uint)((int)uVar58 < iVar28) * iVar28 |
                             ((int)uVar58 >= iVar28) * uVar58;
                    iVar28 = auVar97._12_4_;
                    uVar70 = (uint)((int)uVar59 < iVar28) * iVar28 |
                             ((int)uVar59 >= iVar28) * uVar59;
                    iVar28 = auVar96._0_4_;
                    iVar37 = auVar80._0_4_;
                    uVar50 = (uint)(iVar37 < iVar28) * iVar28 | (uint)(iVar37 >= iVar28) * iVar37;
                    iVar37 = auVar96._4_4_;
                    iVar45 = auVar80._4_4_;
                    uVar57 = (uint)(iVar45 < iVar37) * iVar37 | (uint)(iVar45 >= iVar37) * iVar45;
                    iVar45 = auVar96._8_4_;
                    iVar47 = auVar80._8_4_;
                    iVar90 = auVar80._12_4_;
                    uVar58 = (uint)(iVar47 < iVar45) * iVar45 | (uint)(iVar47 >= iVar45) * iVar47;
                    iVar47 = auVar96._12_4_;
                    uVar59 = (uint)(iVar90 < iVar47) * iVar47 | (uint)(iVar90 >= iVar47) * iVar90;
                    local_228._4_4_ =
                         ((int)uVar67 < (int)uVar57) * uVar57 |
                         ((int)uVar67 >= (int)uVar57) * uVar67;
                    local_228._0_4_ =
                         ((int)uVar61 < (int)uVar50) * uVar50 |
                         ((int)uVar61 >= (int)uVar50) * uVar61;
                    local_228._8_4_ =
                         ((int)uVar68 < (int)uVar58) * uVar58 |
                         ((int)uVar68 >= (int)uVar58) * uVar68;
                    local_228._12_4_ =
                         ((int)uVar70 < (int)uVar59) * uVar59 |
                         ((int)uVar70 >= (int)uVar59) * uVar70;
                    *(undefined1 (*) [16])((long)*ptr_04 + lVar29) = auVar80;
                    *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar96;
                    local_238 = ((int)uVar81 < (int)local_238) * uVar81 |
                                ((int)uVar81 >= (int)local_238) * local_238;
                    uStack_234 = ((int)uVar82 < (int)uStack_234) * uVar82 |
                                 ((int)uVar82 >= (int)uStack_234) * uStack_234;
                    uStack_230 = ((int)uVar83 < (int)uStack_230) * uVar83 |
                                 ((int)uVar83 >= (int)uStack_230) * uStack_230;
                    uStack_22c = ((int)uVar84 < (int)uStack_22c) * uVar84 |
                                 ((int)uVar84 >= (int)uStack_22c) * uStack_22c;
                    vH[1] = uVar34;
                    vH[0] = uVar36;
                    arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table + 8)
                                    ,vH,t,s2Len,(int32_t)uVar32,in_stack_fffffffffffffd08);
                    vH_00[1] = uVar34;
                    vH_00[0] = uVar36;
                    arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table +
                                             0x10),vH_00,t,s2Len,(int32_t)uVar32,
                                    in_stack_fffffffffffffd08);
                    vH_01[1] = uVar34;
                    vH_01[0] = uVar36;
                    arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table +
                                             0x18),vH_01,t,s2Len,(int32_t)uVar32,
                                    in_stack_fffffffffffffd08);
                    vH_02[1] = uVar34;
                    vH_02[0] = uVar36;
                    arr_store_si128(*((ppVar16->field_4).trace)->trace_del_table,vH_02,t,s2Len,
                                    (int32_t)uVar32,in_stack_fffffffffffffd08);
                    local_1c8 = auVar88._0_4_;
                    iStack_1c4 = auVar88._4_4_;
                    iStack_1c0 = auVar88._8_4_;
                    iStack_1bc = auVar88._12_4_;
                    iVar90 = uVar81 - open;
                    iVar93 = uVar82 - open;
                    iVar94 = uVar83 - open;
                    iVar95 = uVar84 - open;
                    local_128 = auVar12._0_4_;
                    iStack_124 = auVar12._4_4_;
                    iStack_120 = auVar12._8_4_;
                    local_128 = local_128 - gap;
                    iStack_124 = iStack_124 - gap;
                    iStack_120 = iStack_120 - gap;
                    iVar60 = iVar60 - gap;
                    auVar39._0_4_ = -(uint)(local_128 < iVar90);
                    auVar39._4_4_ = -(uint)(iStack_124 < iVar93);
                    auVar39._8_4_ = -(uint)(iStack_120 < iVar94);
                    auVar39._12_4_ = -(uint)(iVar60 < iVar95);
                    auVar96 = blendvps(auVar38,auVar97,auVar39);
                    auVar38 = blendvps(auVar62,auVar80,auVar39);
                    local_78 = auVar65._0_4_;
                    iStack_74 = auVar65._4_4_;
                    iStack_70 = auVar65._8_4_;
                    iStack_6c = auVar65._12_4_;
                    auVar78._0_4_ = local_78 + 1;
                    auVar78._4_4_ = iStack_74 + 1;
                    auVar78._8_4_ = iStack_70 + 1;
                    auVar78._12_4_ = iStack_6c + 1;
                    auVar98._0_4_ = iVar28 + 1;
                    auVar98._4_4_ = iVar37 + 1;
                    auVar98._8_4_ = iVar45 + 1;
                    auVar98._12_4_ = iVar47 + 1;
                    auVar62 = blendvps(auVar78,auVar98,auVar39);
                    iVar27 = iVar27 - gap;
                    iVar46 = iVar46 - gap;
                    iVar48 = iVar48 - gap;
                    iVar49 = iVar49 - gap;
                    auVar91._0_4_ = -(uint)(iVar27 < iVar90);
                    auVar91._4_4_ = -(uint)(iVar46 < iVar93);
                    auVar91._8_4_ = -(uint)(iVar48 < iVar94);
                    auVar91._12_4_ = -(uint)(iVar49 < iVar95);
                    auVar85 = blendvps(auVar85,auVar97,auVar91);
                    auVar86 = blendvps(auVar86,auVar80,auVar91);
                    puVar3 = (uint *)((long)*ptr_00 + lVar29);
                    *puVar3 = (uint)(iVar90 < local_128) * local_128 |
                              (uint)(iVar90 >= local_128) * iVar90;
                    puVar3[1] = (uint)(iVar93 < iStack_124) * iStack_124 |
                                (uint)(iVar93 >= iStack_124) * iVar93;
                    puVar3[2] = (uint)(iVar94 < iStack_120) * iStack_120 |
                                (uint)(iVar94 >= iStack_120) * iVar94;
                    puVar3[3] = (uint)(iVar95 < iVar60) * iVar60 | (uint)(iVar95 >= iVar60) * iVar95
                    ;
                    *(undefined1 (*) [16])((long)*b + lVar29) = auVar96;
                    *(undefined1 (*) [16])((long)*b_00 + lVar29) = auVar38;
                    *(undefined1 (*) [16])((long)*b_01 + lVar29) = auVar62;
                    auVar87._0_4_ = local_1c8 + 1;
                    auVar87._4_4_ = iStack_1c4 + 1;
                    auVar87._8_4_ = iStack_1c0 + 1;
                    auVar87._12_4_ = iStack_1bc + 1;
                    auVar88 = blendvps(auVar87,auVar98,auVar91);
                    auVar97._0_4_ =
                         (uint)(iVar90 < iVar27) * iVar27 | (uint)(iVar90 >= iVar27) * iVar90;
                    auVar97._4_4_ =
                         (uint)(iVar93 < iVar46) * iVar46 | (uint)(iVar93 >= iVar46) * iVar93;
                    auVar97._8_4_ =
                         (uint)(iVar94 < iVar48) * iVar48 | (uint)(iVar94 >= iVar48) * iVar94;
                    auVar97._12_4_ =
                         (uint)(iVar95 < iVar49) * iVar49 | (uint)(iVar95 >= iVar49) * iVar95;
                    piVar2 = (int *)((long)*local_2e0 + lVar29);
                    iVar24 = *piVar2;
                    iVar27 = piVar2[1];
                    iVar28 = piVar2[2];
                    iVar46 = piVar2[3];
                    auVar80 = *(undefined1 (*) [16])((long)*local_2c8 + lVar29);
                    auVar76 = *(undefined1 (*) [16])((long)*local_2d0 + lVar29);
                    auVar72 = *(undefined1 (*) [16])((long)*ptr_03 + lVar29);
                    uVar36 = (ulong)((int)uVar36 + 1);
                  }
                  for (iVar27 = 0; iVar27 != 4; iVar27 = iVar27 + 1) {
                    iVar28 = iVar30;
                    if (s2_beg == 0) {
                      iVar28 = ptr_01[uVar35 + 1] - open;
                    }
                    lVar29 = auVar85._8_8_;
                    uVar32 = auVar85._0_8_;
                    auVar85._0_8_ = uVar32 << 0x20;
                    auVar85._8_8_ = lVar29 << 0x20 | uVar32 >> 0x20;
                    lVar29 = auVar86._8_8_;
                    uVar32 = auVar86._0_8_;
                    auVar86._0_8_ = uVar32 << 0x20;
                    auVar86._8_8_ = lVar29 << 0x20 | uVar32 >> 0x20;
                    uVar4 = (undefined4)(*palVar17)[0];
                    auVar52._4_4_ = uVar4;
                    auVar52._0_4_ = uVar4;
                    auVar52._8_4_ = *(undefined4 *)((long)*palVar17 + 4);
                    auVar52._12_4_ = (int)(*palVar17)[1];
                    auVar53._4_4_ = uVar4;
                    auVar53._0_4_ = ptr_01[uVar35];
                    auVar53._8_8_ = auVar52._8_8_;
                    auVar92._0_4_ = auVar97._0_4_;
                    auVar92._4_4_ = auVar92._0_4_;
                    auVar92._8_4_ = auVar97._4_4_;
                    auVar92._12_4_ = auVar97._8_4_;
                    auVar97._4_4_ = auVar92._0_4_;
                    auVar97._0_4_ = iVar28;
                    auVar97._8_8_ = auVar92._8_8_;
                    auVar89._0_4_ = auVar88._0_4_;
                    auVar89._4_4_ = auVar89._0_4_;
                    auVar89._8_4_ = auVar88._4_4_;
                    auVar89._12_4_ = auVar88._8_4_;
                    auVar88._8_8_ = auVar89._8_8_;
                    auVar88._0_8_ = (ulong)auVar89._0_4_ << 0x20 | 1;
                    lVar29 = 0;
                    uVar32 = uVar35;
                    for (uVar36 = 0; uVar34 != uVar36; uVar36 = uVar36 + 1) {
                      piVar2 = (int *)((long)pvVar6 + lVar29 + lVar31);
                      iVar46 = *piVar2;
                      iVar49 = piVar2[1];
                      iVar47 = piVar2[2];
                      iVar60 = piVar2[3];
                      piVar2 = (int *)((long)*ptr_02 + lVar29);
                      iVar90 = *piVar2;
                      iVar93 = piVar2[1];
                      iVar94 = piVar2[2];
                      iVar95 = piVar2[3];
                      iVar28 = auVar97._0_4_;
                      auVar64._0_4_ =
                           (uint)(iVar90 < iVar28) * iVar28 | (uint)(iVar90 >= iVar28) * iVar90;
                      iVar37 = auVar97._4_4_;
                      auVar64._4_4_ =
                           (uint)(iVar93 < iVar37) * iVar37 | (uint)(iVar93 >= iVar37) * iVar93;
                      iVar48 = auVar97._8_4_;
                      auVar64._8_4_ =
                           (uint)(iVar94 < iVar48) * iVar48 | (uint)(iVar94 >= iVar48) * iVar94;
                      iVar45 = auVar97._12_4_;
                      auVar64._12_4_ =
                           (uint)(iVar95 < iVar45) * iVar45 | (uint)(iVar95 >= iVar45) * iVar95;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar29) = auVar64;
                      auVar54._0_4_ = -(uint)(auVar53._0_4_ + iVar46 == auVar64._0_4_);
                      auVar54._4_4_ = -(uint)(auVar53._4_4_ + iVar49 == auVar64._4_4_);
                      auVar54._8_4_ = -(uint)(auVar53._8_4_ + iVar47 == auVar64._8_4_);
                      auVar54._12_4_ = -(uint)(auVar53._12_4_ + iVar60 == auVar64._12_4_);
                      auVar40._0_4_ = -(uint)(iVar28 < iVar90);
                      auVar40._4_4_ = -(uint)(iVar37 < iVar93);
                      auVar40._8_4_ = -(uint)(iVar48 < iVar94);
                      auVar40._12_4_ = -(uint)(iVar45 < iVar95);
                      auVar40 = auVar40 | auVar54;
                      auVar65 = blendvps(auVar85,*(undefined1 (*) [16])((long)*ptr_05 + lVar29),
                                         auVar40);
                      *(undefined1 (*) [16])((long)*ptr_05 + lVar29) = auVar65;
                      auVar38 = blendvps(auVar86,*(undefined1 (*) [16])((long)*ptr_04 + lVar29),
                                         auVar40);
                      *(undefined1 (*) [16])((long)*ptr_04 + lVar29) = auVar38;
                      iVar47 = auVar38._12_4_;
                      auVar62 = blendvps(auVar88,*(undefined1 (*) [16])((long)*ptr + lVar29),auVar40
                                        );
                      *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar62;
                      iVar60 = auVar62._12_4_;
                      local_238 = ((int)auVar64._0_4_ < (int)local_238) * auVar64._0_4_ |
                                  ((int)auVar64._0_4_ >= (int)local_238) * local_238;
                      uStack_234 = ((int)auVar64._4_4_ < (int)uStack_234) * auVar64._4_4_ |
                                   ((int)auVar64._4_4_ >= (int)uStack_234) * uStack_234;
                      uStack_230 = ((int)auVar64._8_4_ < (int)uStack_230) * auVar64._8_4_ |
                                   ((int)auVar64._8_4_ >= (int)uStack_230) * uStack_230;
                      uStack_22c = ((int)auVar64._12_4_ < (int)uStack_22c) * auVar64._12_4_ |
                                   ((int)auVar64._12_4_ >= (int)uStack_22c) * uStack_22c;
                      uVar50 = ((int)local_228._0_4_ < (int)auVar64._0_4_) * auVar64._0_4_ |
                               (uint)((int)local_228._0_4_ >= (int)auVar64._0_4_) * local_228._0_4_;
                      uVar57 = ((int)local_228._4_4_ < (int)auVar64._4_4_) * auVar64._4_4_ |
                               (uint)((int)local_228._4_4_ >= (int)auVar64._4_4_) * local_228._4_4_;
                      uVar58 = ((int)local_228._8_4_ < (int)auVar64._8_4_) * auVar64._8_4_ |
                               (uint)((int)local_228._8_4_ >= (int)auVar64._8_4_) * local_228._8_4_;
                      uVar59 = ((int)local_228._12_4_ < (int)auVar64._12_4_) * auVar64._12_4_ |
                               (uint)((int)local_228._12_4_ >= (int)auVar64._12_4_) *
                               local_228._12_4_;
                      iVar46 = auVar65._0_4_;
                      uVar50 = (uint)((int)uVar50 < iVar46) * iVar46 |
                               ((int)uVar50 >= iVar46) * uVar50;
                      iVar46 = auVar65._4_4_;
                      uVar57 = (uint)((int)uVar57 < iVar46) * iVar46 |
                               ((int)uVar57 >= iVar46) * uVar57;
                      iVar46 = auVar65._8_4_;
                      uVar58 = (uint)((int)uVar58 < iVar46) * iVar46 |
                               ((int)uVar58 >= iVar46) * uVar58;
                      iVar46 = auVar65._12_4_;
                      uVar59 = (uint)((int)uVar59 < iVar46) * iVar46 |
                               ((int)uVar59 >= iVar46) * uVar59;
                      iVar46 = auVar62._0_4_;
                      iVar49 = auVar38._0_4_;
                      uVar61 = (uint)(iVar49 < iVar46) * iVar46 | (uint)(iVar49 >= iVar46) * iVar49;
                      iVar46 = auVar62._4_4_;
                      iVar49 = auVar38._4_4_;
                      uVar67 = (uint)(iVar49 < iVar46) * iVar46 | (uint)(iVar49 >= iVar46) * iVar49;
                      iVar46 = auVar62._8_4_;
                      iVar49 = auVar38._8_4_;
                      uVar68 = (uint)(iVar49 < iVar46) * iVar46 | (uint)(iVar49 >= iVar46) * iVar49;
                      uVar70 = (uint)(iVar47 < iVar60) * iVar60 | (uint)(iVar47 >= iVar60) * iVar47;
                      local_228._4_4_ =
                           ((int)uVar67 < (int)uVar57) * uVar57 |
                           ((int)uVar67 >= (int)uVar57) * uVar67;
                      local_228._0_4_ =
                           ((int)uVar61 < (int)uVar50) * uVar50 |
                           ((int)uVar61 >= (int)uVar50) * uVar61;
                      local_228._8_4_ =
                           ((int)uVar68 < (int)uVar58) * uVar58 |
                           ((int)uVar68 >= (int)uVar58) * uVar68;
                      local_228._12_4_ =
                           ((int)uVar70 < (int)uVar59) * uVar59 |
                           ((int)uVar70 >= (int)uVar59) * uVar70;
                      vH_03[0] = uVar36 & 0xffffffff;
                      vH_03[1] = uVar34;
                      arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table +
                                               8),vH_03,t,s2Len,(int32_t)uVar32,
                                      in_stack_fffffffffffffd08);
                      vH_04[0] = uVar36 & 0xffffffff;
                      vH_04[1] = uVar34;
                      arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table +
                                               0x10),vH_04,t,s2Len,(int32_t)uVar32,
                                      in_stack_fffffffffffffd08);
                      vH_05[0] = uVar36 & 0xffffffff;
                      vH_05[1] = uVar34;
                      arr_store_si128(*(int **)((long)((ppVar16->field_4).trace)->trace_del_table +
                                               0x18),vH_05,t,s2Len,(int32_t)uVar32,
                                      in_stack_fffffffffffffd08);
                      vH_06[0] = uVar36 & 0xffffffff;
                      vH_06[1] = uVar34;
                      arr_store_si128(*((ppVar16->field_4).trace)->trace_del_table,vH_06,t,s2Len,
                                      (int32_t)uVar32,in_stack_fffffffffffffd08);
                      auVar97._0_4_ = iVar28 - gap;
                      auVar97._4_4_ = iVar37 - gap;
                      auVar97._8_4_ = iVar48 - gap;
                      auVar97._12_4_ = iVar45 - gap;
                      auVar41._0_4_ = -(uint)((int)auVar97._0_4_ < (int)(auVar64._0_4_ - open));
                      auVar41._4_4_ = -(uint)((int)auVar97._4_4_ < (int)(auVar64._4_4_ - open));
                      auVar41._8_4_ = -(uint)((int)auVar97._8_4_ < (int)(auVar64._8_4_ - open));
                      auVar41._12_4_ = -(uint)((int)auVar97._12_4_ < (int)(auVar64._12_4_ - open));
                      iVar28 = movmskps(extraout_EAX,auVar41);
                      if (iVar28 == 0xf) goto LAB_00695840;
                      auVar85 = blendvps(auVar85,auVar65,auVar41);
                      auVar86 = blendvps(auVar86,auVar38,auVar41);
                      auVar38 = blendvps(auVar88,auVar62,auVar41);
                      auVar88._0_4_ = auVar38._0_4_ + 1;
                      auVar88._4_4_ = auVar38._4_4_ + 1;
                      auVar88._8_4_ = auVar38._8_4_ + 1;
                      auVar88._12_4_ = auVar38._12_4_ + 1;
                      auVar53 = *(undefined1 (*) [16])((long)*local_2e0 + lVar29);
                      lVar29 = lVar29 + 0x10;
                    }
                  }
LAB_00695840:
                  palVar17 = ptr_02 + uVar71;
                  iVar27 = (int)(*palVar17)[0];
                  iVar28 = *(int *)((long)*palVar17 + 4);
                  iVar46 = (int)(*palVar17)[1];
                  iVar37 = *(int *)((long)*palVar17 + 0xc);
                  auVar42._0_4_ = -(uint)((int)local_168._0_4_ < iVar27);
                  auVar42._4_4_ = -(uint)((int)local_168._4_4_ < iVar28);
                  auVar42._8_4_ = -(uint)((int)local_168._8_4_ < iVar46);
                  auVar42._12_4_ = -(uint)((int)local_168._12_4_ < iVar37);
                  local_148 = blendvps(local_148,(undefined1  [16])ptr_05[uVar71],auVar42);
                  auVar74 = blendvps(auVar74,(undefined1  [16])ptr_04[uVar71],auVar42);
                  local_158 = blendvps(local_158,(undefined1  [16])ptr[uVar71],auVar42);
                  local_168._4_4_ =
                       (uint)((int)local_168._4_4_ < iVar28) * iVar28 |
                       (uint)((int)local_168._4_4_ >= iVar28) * local_168._4_4_;
                  local_168._0_4_ =
                       (uint)((int)local_168._0_4_ < iVar27) * iVar27 |
                       (uint)((int)local_168._0_4_ >= iVar27) * local_168._0_4_;
                  local_168._8_4_ =
                       (uint)((int)local_168._8_4_ < iVar46) * iVar46 |
                       (uint)((int)local_168._8_4_ >= iVar46) * local_168._8_4_;
                  local_168._12_4_ =
                       (uint)((int)local_168._12_4_ < iVar37) * iVar37 |
                       (uint)((int)local_168._12_4_ >= iVar37) * local_168._12_4_;
                  auVar11._4_4_ = -(uint)(uVar21 == 2);
                  auVar11._0_4_ = -(uint)(uVar21 == 3);
                  auVar11._8_4_ = -(uint)(uVar21 == 1);
                  auVar11._12_4_ = -(uint)(uVar21 == 0);
                  iVar27 = movmskps((int)uVar71 * 0x10,auVar42 & auVar11);
                  if (iVar27 != 0) {
                    local_2f0 = t;
                  }
                  uVar35 = uVar35 + 1;
                  palVar17 = local_2e0;
                  palVar20 = ptr;
                  palVar19 = local_2d0;
                  palVar18 = local_2c8;
                  ptr = ptr_03;
                  local_2e0 = ptr_02;
                  local_2d0 = ptr_04;
                  local_2c8 = ptr_05;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar23 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_table_striped_profile_sse41_128_32",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile32.score;
    vProfileM = (__m128i*)profile->profile32.matches;
    vProfileS = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);
        vHM = _mm_slli_si128(vHM, 4);
        vHS = _mm_slli_si128(vHS, 4);
        vHL = _mm_slli_si128(vHL, 4);

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi32(vH_dag, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi32(vH, vH_dag);
            case2 = _mm_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi32(vEL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vFL, vOne),
                    _mm_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 4);
            vF = _mm_slli_si128(vF, 4);
            vFM = _mm_slli_si128(vFM, 4);
            vFS = _mm_slli_si128(vFS, 4);
            vFL = _mm_slli_si128(vFL, 4);
            vHp = _mm_insert_epi32(vHp, boundary[j], 0);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            vFL = _mm_insert_epi32(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi32(vH, vHp);
                case2 = _mm_cmpeq_epi32(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi32(vFL, vOne),
                        _mm_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi32(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
        result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
            vMaxHM = _mm_slli_si128(vMaxHM, 4);
            vMaxHS = _mm_slli_si128(vMaxHS, 4);
            vMaxHL = _mm_slli_si128(vMaxHL, 4);
        }
        end_query = s1Len-1;
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        matches = (int32_t) _mm_extract_epi32(vMaxHM, 3);
        similar = (int32_t) _mm_extract_epi32(vMaxHS, 3);
        length = (int32_t) _mm_extract_epi32(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t *m = (int32_t*)pvHMStore;
        int32_t *s = (int32_t*)pvHSStore;
        int32_t *l = (int32_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}